

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmcalc.cpp
# Opt level: O2

void __thiscall
fmcalc::parse_policytc(fmcalc *this,vector<fm_policyTC,_std::allocator<fm_policyTC>_> *p)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  FILE *__stream;
  size_t sVar3;
  iterator iVar4;
  int iVar5;
  int j;
  int iVar6;
  int iVar7;
  pointer pfVar8;
  int local_d4;
  layer_agg l_1;
  layer_agg l;
  int iStack_b0;
  string file;
  fm_policyTC f;
  set<layer_agg,_std::less<layer_agg>,_std::allocator<layer_agg>_> la;
  
  std::__cxx11::string::string((string *)&file,"input/fm_policytc.bin",(allocator *)&la);
  if ((this->inputpath_)._M_string_length != 0) {
    std::__cxx11::string::substr((ulong)&f,(ulong)&file);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&la,
                   &this->inputpath_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f);
    std::__cxx11::string::operator=((string *)&file,(string *)&la);
    std::__cxx11::string::~string((string *)&la);
    std::__cxx11::string::~string((string *)&f);
  }
  __stream = fopen(file._M_dataplus._M_p,"rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"FATAL: %s: cannot open %s\n","parse_policytc",file._M_dataplus._M_p);
    exit(1);
  }
  local_d4 = 0;
  while (sVar3 = fread(&f,0x10,1,__stream), sVar3 != 0) {
    std::vector<fm_policyTC,_std::allocator<fm_policyTC>_>::push_back(p,&f);
    if (local_d4 < f.level_id) {
      local_d4 = f.level_id;
    }
  }
  fclose(__stream);
  p_Var1 = &la._M_t._M_impl.super__Rb_tree_header;
  la._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  la._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  la._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  iVar5 = 0;
  iVar7 = 0;
  pfVar8 = (p->super__Vector_base<fm_policyTC,_std::allocator<fm_policyTC>_>)._M_impl.
           super__Vector_impl_data._M_start;
  la._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  la._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  for (; pfVar8 != (p->super__Vector_base<fm_policyTC,_std::allocator<fm_policyTC>_>)._M_impl.
                   super__Vector_impl_data._M_finish; pfVar8 = pfVar8 + 1) {
    if (pfVar8->level_id == local_d4) {
      iVar2 = pfVar8->agg_id;
      iVar6 = pfVar8->layer_id;
      l.agg_id = iVar2;
      l.layer_id = iVar6;
      std::
      _Rb_tree<layer_agg,layer_agg,std::_Identity<layer_agg>,std::less<layer_agg>,std::allocator<layer_agg>>
      ::_M_insert_unique<layer_agg_const&>
                ((_Rb_tree<layer_agg,layer_agg,std::_Identity<layer_agg>,std::less<layer_agg>,std::allocator<layer_agg>>
                  *)&la,&l);
      if (iVar7 < iVar6) {
        iVar7 = iVar6;
      }
      if (iVar5 < iVar2) {
        iVar5 = iVar2;
      }
    }
  }
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  iVar2 = 0;
  if (0 < iVar7) {
    iVar2 = iVar7;
  }
  for (iVar7 = 1; iVar7 != iVar2 + 1; iVar7 = iVar7 + 1) {
    for (iVar6 = 1; iVar6 - iVar5 != 1; iVar6 = iVar6 + 1) {
      l_1.layer_id = iVar7;
      l_1.agg_id = iVar6;
      iVar4 = std::
              _Rb_tree<layer_agg,_layer_agg,_std::_Identity<layer_agg>,_std::less<layer_agg>,_std::allocator<layer_agg>_>
              ::find(&la._M_t,&l_1);
      if ((_Rb_tree_header *)iVar4._M_node == p_Var1) {
        iStack_b0 = l_1.layer_id;
        l.agg_id = l_1.agg_id;
        l.layer_id = local_d4;
        std::vector<fm_policyTC,_std::allocator<fm_policyTC>_>::push_back(p,(value_type *)&l);
      }
    }
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<fm_policyTC*,std::vector<fm_policyTC,std::allocator<fm_policyTC>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((p->super__Vector_base<fm_policyTC,_std::allocator<fm_policyTC>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (p->super__Vector_base<fm_policyTC,_std::allocator<fm_policyTC>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  std::
  _Rb_tree<layer_agg,_layer_agg,_std::_Identity<layer_agg>,_std::less<layer_agg>,_std::allocator<layer_agg>_>
  ::~_Rb_tree(&la._M_t);
  std::__cxx11::string::~string((string *)&file);
  return;
}

Assistant:

void fmcalc::parse_policytc(std::vector< fm_policyTC> &p)
{
	FILE* fin = NULL;
	std::string file = FMPOLICYTC_FILE;
	if (inputpath_.length() > 0) {
		file = inputpath_ + file.substr(5);
	}
	fin = fopen(file.c_str(), "rb");

	if (fin == NULL) {
		fprintf(stderr, "FATAL: %s: cannot open %s\n", __func__, file.c_str());
		exit(EXIT_FAILURE);
	}
	fm_policyTC f;
	
	int max_layer_id = 0;
	int max_level_id = 0;
	size_t i = fread(&f, sizeof(f), 1, fin);
	while (i != 0) {
		p.push_back(f);		
		if (f.level_id > max_level_id) max_level_id = f.level_id;			
		i = fread(&f, sizeof(f), 1, fin);
	}
	fclose(fin);
	std::set<layer_agg> la;
	auto iter = p.begin();
	int max_agg_id = 0;

	while (iter != p.end()) {
		if (iter->level_id == max_level_id) {
			if (iter->agg_id > max_agg_id) max_agg_id = iter->agg_id;
			if (iter->layer_id > max_layer_id) max_layer_id = iter->layer_id;
			layer_agg l;
			l.agg_id = iter->agg_id;
			l.layer_id = iter->layer_id;
			la.insert(l);
		}
		iter++;
	}


	for (int i = 1;i <= max_layer_id;i++) {
		for (int j = 1;j <= max_agg_id;j++) {
			layer_agg l;
			l.layer_id = i;
			l.agg_id = j;
			auto iter = la.find(l);
			if (iter == la.end()) {
				fm_policyTC f;
				f.agg_id = l.agg_id;
				f.layer_id = l.layer_id;
				f.level_id = max_level_id;
				f.profile_id = noop_profile_id;
				p.push_back(f);
			}
		}
	}


	std::sort(p.begin(), p.end());

}